

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

DSPOMDP * __thiscall MyPlanner::InitializeModel(MyPlanner *this,Option *options)

{
  long lVar1;
  LaserTag *this_00;
  allocator<char> local_39;
  string local_38;
  
  lVar1 = *(long *)(options + 0x70);
  this_00 = (LaserTag *)operator_new(0x180);
  if (lVar1 == 0) {
    despot::LaserTag::LaserTag(this_00);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,*(char **)(options + 0x80),&local_39);
    despot::LaserTag::LaserTag(this_00,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return (DSPOMDP *)&(this_00->super_BaseTag).super_BeliefMDP;
}

Assistant:

DSPOMDP* InitializeModel(option::Option* options) {
    DSPOMDP* model = !options[E_PARAMS_FILE] ?
      new LaserTag() : new LaserTag(options[E_PARAMS_FILE].arg);
    return model;
  }